

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O2

void __thiscall
IRT::CEseqFloatVisitor::Visit(CEseqFloatVisitor *this,CJumpConditionalStatement *statement)

{
  __uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> _Var1;
  undefined8 uVar2;
  TLogicOperator TVar3;
  CExpression *pCVar4;
  CEseqExpression *pCVar5;
  long lVar6;
  CJumpConditionalStatement *pCVar7;
  CStatement *pCVar8;
  INode IVar9;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> rightEseq;
  pointer_____offset_0x10___ *cjump;
  INode IVar10;
  undefined1 local_c0 [16];
  __uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_b0;
  undefined1 local_a8 [16];
  _Head_base<0UL,_const_IRT::CLabelStatement_*,_false> local_98;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_90;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_88;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_80;
  _Head_base<0UL,_const_IRT::CLabelStatement_*,_false> local_78;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_70;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_68;
  undefined1 local_60 [24];
  undefined1 local_48 [16];
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_38;
  
  pCVar4 = CJumpConditionalStatement::LeftOperand(statement);
  (**(pCVar4->super_IExpression).super_INode._vptr_INode)(pCVar4,this);
  rightEseq._M_head_impl =
       (this->childExpression)._M_t.
       super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
       .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  pCVar4 = CJumpConditionalStatement::RightOperand(statement);
  cjump = (pointer_____offset_0x10___ *)this;
  (**(pCVar4->super_IExpression).super_INode._vptr_INode)(pCVar4);
  IVar10._vptr_INode =
       (_func_int **)
       (this->childExpression)._M_t.
       super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
       .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  if ((CEseqExpression *)rightEseq._M_head_impl == (CEseqExpression *)0x0) {
    pCVar5 = (CEseqExpression *)0x0;
  }
  else {
    cjump = &CExpression::typeinfo;
    pCVar5 = (CEseqExpression *)
             __dynamic_cast(rightEseq._M_head_impl,&CExpression::typeinfo,&CEseqExpression::typeinfo
                            ,0);
  }
  if ((CJumpConditionalStatement *)IVar10._vptr_INode == (CJumpConditionalStatement *)0x0) {
    lVar6 = 0;
  }
  else {
    cjump = &CExpression::typeinfo;
    lVar6 = __dynamic_cast(IVar10._vptr_INode,&CExpression::typeinfo,&CEseqExpression::typeinfo,0);
  }
  if (pCVar5 == (CEseqExpression *)0x0 && lVar6 == 0) {
    pCVar7 = (CJumpConditionalStatement *)operator_new(0x30);
    TVar3 = CJumpConditionalStatement::Operation(statement);
    local_70._M_head_impl = (CExpression *)IVar10._vptr_INode;
    local_38._M_head_impl = rightEseq._M_head_impl;
    CJumpConditionalStatement::TrueLabel(statement);
    CLabelStatement::CastCopy((CLabelStatement *)local_c0);
    local_78._M_head_impl = (CLabelStatement *)local_c0._0_8_;
    local_c0._0_8_ = (CJumpConditionalStatement *)0x0;
    CJumpConditionalStatement::FalseLabel(statement);
    CLabelStatement::CastCopy((CLabelStatement *)(local_c0 + 8));
    local_48._8_8_ = local_c0._8_8_;
    local_c0._8_8_ = (long *)0x0;
    CJumpConditionalStatement::CJumpConditionalStatement
              (pCVar7,TVar3,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_38,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_70,
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)&local_78,
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)(local_48 + 8));
    pCVar8 = (this->childStatement)._M_t.
             super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
             .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
    (this->childStatement)._M_t.
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)pCVar7;
    if (pCVar8 != (CStatement *)0x0) {
      (**(code **)((long)(pCVar8->super_IStatement).super_INode + 0x10))();
    }
    if ((long *)local_48._8_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_48._8_8_ + 0x10))();
    }
    local_48._8_8_ = 0;
    if ((long *)local_c0._8_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_c0._8_8_ + 0x10))();
    }
    if ((CJumpConditionalStatement *)local_78._M_head_impl != (CJumpConditionalStatement *)0x0) {
      (*(((IExpression *)&(local_78._M_head_impl)->super_CStatement)->super_INode)._vptr_INode[2])()
      ;
    }
    local_78._M_head_impl = (CLabelStatement *)0x0;
    if ((CJumpConditionalStatement *)local_c0._0_8_ != (CJumpConditionalStatement *)0x0) {
      (**(code **)((long)*(IExpression *)local_c0._0_8_ + 0x10))();
    }
    if ((CJumpConditionalStatement *)local_70._M_head_impl != (CJumpConditionalStatement *)0x0) {
      (*((local_70._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_70._M_head_impl = (CExpression *)0x0;
    rightEseq._M_head_impl = local_38._M_head_impl;
    goto LAB_00131c85;
  }
  if ((pCVar5 == (CEseqExpression *)0x0) && (lVar6 != 0)) {
    processRightEseqInCJump
              ((CEseqFloatVisitor *)local_c0,(CJumpConditionalStatement *)cjump,
               (CExpression *)statement,(CEseqExpression *)rightEseq._M_head_impl);
    IVar9._vptr_INode =
         (_func_int **)
         (this->childStatement)._M_t.
         super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>.
         _M_t.
         super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
         .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
    (this->childStatement)._M_t.
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl =
         (CStatement *)local_c0._0_8_;
LAB_00131a78:
    if ((CJumpConditionalStatement *)IVar9._vptr_INode != (CJumpConditionalStatement *)0x0) {
      (**(code **)((long)*IVar9._vptr_INode + 0x10))();
    }
LAB_00131a83:
    if ((CJumpConditionalStatement *)IVar10._vptr_INode == (CJumpConditionalStatement *)0x0)
    goto LAB_00131c85;
    IVar9._vptr_INode =
         (((IExpression *)&((CJumpConditionalStatement *)IVar10._vptr_INode)->super_CStatement)->
         super_INode)._vptr_INode;
  }
  else {
    if ((pCVar5 == (CEseqExpression *)0x0) || (lVar6 != 0)) {
      if ((pCVar5 != (CEseqExpression *)0x0) && (lVar6 != 0)) {
        local_a8._0_8_ = operator_new(0x18);
        pCVar7 = (CJumpConditionalStatement *)CEseqExpression::getStatement(pCVar5);
        (*(pCVar7->super_CStatement).super_IStatement.super_INode._vptr_INode[3])(local_c0);
        local_b0._M_t.
        super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
        .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
             (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
             (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
             local_c0._0_8_;
        local_a8._8_8_ = local_c0._0_8_;
        local_c0._0_8_ = (CJumpConditionalStatement *)0x0;
        pCVar5 = (CEseqExpression *)CEseqExpression::getExpression(pCVar5);
        processRightEseqInCJump
                  ((CEseqFloatVisitor *)(local_c0 + 8),pCVar7,(CExpression *)statement,pCVar5);
        uVar2 = local_a8._0_8_;
        local_68._M_head_impl = (CStatement *)local_c0._8_8_;
        CSeqStatement::CSeqStatement
                  ((CSeqStatement *)local_a8._0_8_,
                   (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *
                   )(local_a8 + 8),
                   (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *
                   )&local_68);
        pCVar8 = (this->childStatement)._M_t.
                 super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
                 .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
        (this->childStatement)._M_t.
        super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>.
        _M_t.
        super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
        .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)uVar2;
        if (pCVar8 != (CStatement *)0x0) {
          (**(code **)((long)(pCVar8->super_IStatement).super_INode + 0x10))();
        }
        if (local_68._M_head_impl != (CStatement *)0x0) {
          (*((local_68._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
        }
        local_68._M_head_impl = (CStatement *)0x0;
        if ((CJumpConditionalStatement *)local_a8._8_8_ != (CJumpConditionalStatement *)0x0) {
          (**(code **)((long)*(IExpression *)local_a8._8_8_ + 0x10))();
        }
        local_a8._8_8_ = 0;
        IVar9._vptr_INode = (_func_int **)local_c0._0_8_;
        goto LAB_00131a78;
      }
      goto LAB_00131a83;
    }
    local_a8._0_8_ = operator_new(0x18);
    pCVar8 = CEseqExpression::getStatement(pCVar5);
    (*(pCVar8->super_IStatement).super_INode._vptr_INode[3])(local_c0,pCVar8);
    local_80._M_head_impl = (CStatement *)local_c0._0_8_;
    local_c0._0_8_ = (CJumpConditionalStatement *)0x0;
    local_b0._M_t.
    super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
    super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
         (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
         operator_new(0x30);
    TVar3 = CJumpConditionalStatement::Operation(statement);
    pCVar4 = CEseqExpression::getExpression(pCVar5);
    (*(pCVar4->super_IExpression).super_INode._vptr_INode[3])(local_c0 + 8,pCVar4);
    local_88._M_head_impl = (CExpression *)local_c0._8_8_;
    local_c0._8_8_ = (long *)0x0;
    local_90._M_head_impl = (CExpression *)IVar10._vptr_INode;
    CJumpConditionalStatement::TrueLabel(statement);
    CLabelStatement::CastCopy((CLabelStatement *)(local_60 + 0x10));
    local_98._M_head_impl = (CLabelStatement *)local_60._16_8_;
    local_60._16_8_ = (CLabelStatement *)0x0;
    CJumpConditionalStatement::FalseLabel(statement);
    CLabelStatement::CastCopy((CLabelStatement *)local_60);
    uVar2 = local_a8._0_8_;
    _Var1._M_t.
    super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
    super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
         (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
         (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)local_b0;
    local_60._8_8_ = local_60._0_8_;
    local_60._0_8_ = (_func_int **)0x0;
    CJumpConditionalStatement::CJumpConditionalStatement
              ((CJumpConditionalStatement *)
               local_b0._M_t.
               super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
               .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl,TVar3,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_88,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_90,
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)&local_98,
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)(local_60 + 8));
    local_48._0_8_ =
         _Var1._M_t.
         super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
         .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
    CSeqStatement::CSeqStatement
              ((CSeqStatement *)uVar2,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_80,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               local_48);
    pCVar8 = (this->childStatement)._M_t.
             super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
             .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
    (this->childStatement)._M_t.
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)uVar2;
    if (pCVar8 != (CStatement *)0x0) {
      (**(code **)((long)(pCVar8->super_IStatement).super_INode + 0x10))();
    }
    if ((CJumpConditionalStatement *)local_48._0_8_ != (CJumpConditionalStatement *)0x0) {
      (**(code **)((long)*(IExpression *)local_48._0_8_ + 0x10))();
    }
    local_48._0_8_ = 0;
    if ((_func_int **)local_60._8_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_60._8_8_ + 0x10))();
    }
    local_60._8_8_ = (pointer)0x0;
    if ((_func_int **)local_60._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_60._0_8_ + 0x10))();
    }
    if (local_98._M_head_impl != (CLabelStatement *)0x0) {
      (**(code **)((long)((local_98._M_head_impl)->super_CStatement).super_IStatement.super_INode +
                  0x10))();
    }
    local_98._M_head_impl = (CLabelStatement *)0x0;
    if ((CLabelStatement *)local_60._16_8_ != (CLabelStatement *)0x0) {
      (**(code **)((long)(((CStatement *)local_60._16_8_)->super_IStatement).super_INode + 0x10))();
    }
    if ((CJumpConditionalStatement *)local_90._M_head_impl != (CJumpConditionalStatement *)0x0) {
      (*((local_90._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_90._M_head_impl = (CExpression *)0x0;
    if (local_88._M_head_impl != (CExpression *)0x0) {
      (*((local_88._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_88._M_head_impl = (CExpression *)0x0;
    if ((long *)local_c0._8_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_c0._8_8_ + 0x10))();
    }
    if ((CJumpConditionalStatement *)local_80._M_head_impl != (CJumpConditionalStatement *)0x0) {
      (*(((IExpression *)&(local_80._M_head_impl)->super_IStatement)->super_INode)._vptr_INode[2])()
      ;
    }
    local_80._M_head_impl = (CStatement *)0x0;
    if ((_func_int **)local_c0._0_8_ == (_func_int **)0x0) goto LAB_00131c85;
    IVar9._vptr_INode = *(_func_int ***)local_c0._0_8_;
    IVar10._vptr_INode = (_func_int **)local_c0._0_8_;
  }
  (**(code **)((long)IVar9._vptr_INode + 0x10))(IVar10._vptr_INode);
LAB_00131c85:
  if ((CEseqExpression *)rightEseq._M_head_impl != (CEseqExpression *)0x0) {
    (*(((CEseqExpression *)rightEseq._M_head_impl)->super_CExpression).super_IExpression.super_INode
      ._vptr_INode[2])(rightEseq._M_head_impl);
  }
  return;
}

Assistant:

void IRT::CEseqFloatVisitor::Visit(const IRT::CJumpConditionalStatement &statement) {
    statement.LeftOperand()->Accept(*this);
    std::unique_ptr<const CExpression> left = std::move(childExpression);

    statement.RightOperand()->Accept(*this);
    std::unique_ptr<const CExpression> right = std::move(childExpression);

    const CEseqExpression* leftEseq = CAST_TO_ESEQ(left.get());
    const CEseqExpression* rightEseq = CAST_TO_ESEQ(right.get());

    if (leftEseq == nullptr && rightEseq == nullptr) {
        childStatement = SMOVE_UNIQ(new CJumpConditionalStatement(
                statement.Operation(),
                std::move(left),
                std::move(right),
                std::move(statement.TrueLabel()->CastCopy()),
                std::move(statement.FalseLabel()->CastCopy())
        ));

        return;
    }

    if (leftEseq == nullptr && rightEseq != nullptr) {
        childStatement = std::move(processRightEseqInCJump(&statement, left.get(), rightEseq));
        return;
    }

    if (leftEseq != nullptr && rightEseq == nullptr) {
        childStatement = SMOVE_UNIQ(new CSeqStatement(
                std::move(leftEseq->getStatement()->Copy()),
                SMOVE_UNIQ(new CJumpConditionalStatement(
                        statement.Operation(),
                        std::move(leftEseq->getExpression()->Copy()),
                        std::move(right),
                        std::move(statement.TrueLabel()->CastCopy()),
                        std::move(statement.FalseLabel()->CastCopy())
                ))
        ));
        return;
    }

    if (leftEseq != nullptr && rightEseq != nullptr) {
        childStatement = SMOVE_UNIQ(new CSeqStatement(
                std::move(leftEseq->getStatement()->Copy()),
                std::move(processRightEseqInCJump(&statement, leftEseq->getExpression(), rightEseq))
        ));

        return;
    }
}